

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O3

string * __thiscall dns::Message::asString_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  uint *puVar1;
  ostream *poVar2;
  long *plVar3;
  pointer ppQVar4;
  pointer ppRVar5;
  ostringstream text;
  string local_1d0;
  string *local_1b0;
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Header:",7);
  std::ios::widen((char)(ostringstream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ID: ",4);
  puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
  *puVar1 = *puVar1 | 0x200;
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  puVar1 = (uint *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x18);
  *puVar1 = *puVar1 & 0xfffffdff;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  fields: [ QR: ",0x10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," opCode: ",9);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ]",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  QDcount: ",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ANcount: ",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  NScount: ",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ARcount: ",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((this->mQueries).super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->mQueries).super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Queries:",8);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    ppQVar4 = (this->mQueries).
              super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppQVar4 !=
        (this->mQueries).
        super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
        QuerySection::asString_abi_cxx11_(&local_1d0,*ppQVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        ppQVar4 = ppQVar4 + 1;
      } while (ppQVar4 !=
               (this->mQueries).
               super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
  }
  if ((this->mAnswers).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->mAnswers).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Answers:",8);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    ppRVar5 = (this->mAnswers).
              super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppRVar5 !=
        (this->mAnswers).
        super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
        ResourceRecord::asString_abi_cxx11_(&local_1d0,*ppRVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        ppRVar5 = ppRVar5 + 1;
      } while (ppRVar5 !=
               (this->mAnswers).
               super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  if ((this->mAuthorities).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->mAuthorities).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Authorities:",0xc);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    ppRVar5 = (this->mAuthorities).
              super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppRVar5 !=
        (this->mAuthorities).
        super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
        ResourceRecord::asString_abi_cxx11_(&local_1d0,*ppRVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        ppRVar5 = ppRVar5 + 1;
      } while (ppRVar5 !=
               (this->mAuthorities).
               super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  if ((this->mAdditional).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->mAdditional).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Additional:",0xb);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    ppRVar5 = (this->mAdditional).
              super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppRVar5 !=
        (this->mAdditional).
        super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
        ResourceRecord::asString_abi_cxx11_(&local_1d0,*ppRVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        ppRVar5 = ppRVar5 + 1;
      } while (ppRVar5 !=
               (this->mAdditional).
               super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return local_1b0;
}

Assistant:

string Message::asString()
{
    ostringstream text;
    text << "Header:" << endl;
    text << "ID: " << showbase << hex << mId << endl << noshowbase;
    text << "  fields: [ QR: " << mQr << " opCode: " << mOpCode << " ]" << endl;
    text << "  QDcount: " << mQueries.size() << endl;
    text << "  ANcount: " << mAnswers.size() << endl;
    text << "  NScount: " << mAuthorities.size() << endl;
    text << "  ARcount: " << mAdditional.size() << endl;

    if (mQueries.size() > 0)
    {
        text << "Queries:" << endl;
        for(std::vector<QuerySection*>::iterator it = mQueries.begin(); it != mQueries.end(); ++it)
            text << "  " << (*it)->asString();
    }

    if (mAnswers.size() > 0)
    {
        text << "Answers:" << endl;
        for(std::vector<ResourceRecord*>::iterator it = mAnswers.begin(); it != mAnswers.end(); ++it)
            text << "  " << (*it)->asString();
    }

    if (mAuthorities.size() > 0)
    {
        text << "Authorities:" << endl;
        for(std::vector<ResourceRecord*>::iterator it = mAuthorities.begin(); it != mAuthorities.end(); ++it)
            text << "  " << (*it)->asString();
    }

    if (mAdditional.size() > 0)
    {
        text << "Additional:" << endl;
        for(std::vector<ResourceRecord*>::iterator it = mAdditional.begin(); it != mAdditional.end(); ++it)
            text << "  " << (*it)->asString();
    }


    return text.str();
}